

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O3

int AF_A_KillTracer(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AActor *killtarget;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  AActor *source;
  AActor *inflictor;
  PClassActor *pPVar6;
  AActor *origin;
  int selector;
  char *pcVar7;
  int flags;
  int selector_00;
  int iVar8;
  bool bVar9;
  PClassActor *local_40;
  FName local_38;
  FName local_34;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_0068526c;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0068525c;
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_00684f3e;
    pPVar5 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(origin->super_DThinker).super_DObject._vptr_DObject)();
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (origin->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar9 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar9) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0068526c;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_0068525c;
LAB_00684f3e:
    origin = (AActor *)0x0;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_0068525c:
        pcVar7 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_0068526c;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar5 = (PClass *)puVar2[1];
          if (pPVar5 == (PClass *)0x0) {
            pPVar5 = (PClass *)(**(code **)*puVar2)();
            puVar2[1] = pPVar5;
          }
          bVar9 = pPVar5 != (PClass *)0x0;
          if (pPVar5 != pPVar3 && bVar9) {
            do {
              pPVar5 = pPVar5->ParentClass;
              bVar9 = pPVar5 != (PClass *)0x0;
              if (pPVar5 == pPVar3) break;
            } while (pPVar5 != (PClass *)0x0);
          }
          if (!bVar9) {
            pcVar7 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_0068526c;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_0068525c;
    }
    if (2 < numparam) {
      VVar1 = param[2].field_0.field_3.Type;
      if ((VVar1 != 0xff) &&
         ((VVar1 != '\x03' ||
          ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
        pcVar7 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
        ;
LAB_0068526c:
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x1939,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      if (numparam != 3) {
        VVar1 = param[3].field_0.field_3.Type;
        if (VVar1 == '\0') {
          iVar4 = param[3].field_0.i;
        }
        else {
          iVar4 = 0;
          if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x193a,
                          "int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
          }
        }
        if ((uint)numparam < 5) {
          local_40 = (PClassActor *)0x0;
          flags = 0;
LAB_006851c3:
          iVar8 = 0;
LAB_006851c6:
          selector = 0;
        }
        else {
          VVar1 = param[4].field_0.field_3.Type;
          if (VVar1 == '\0') {
            flags = param[4].field_0.i;
          }
          else {
            flags = 0;
            if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                            ,0x193b,
                            "int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
          }
          if (numparam == 5) {
            local_40 = (PClassActor *)0x0;
            goto LAB_006851c3;
          }
          VVar1 = param[5].field_0.field_3.Type;
          if (VVar1 == 0xff) goto LAB_00685185;
          if (VVar1 != '\x03') {
LAB_0068528d:
            pcVar7 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
            ;
LAB_00685294:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x193c,
                          "int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
          }
          local_40 = (PClassActor *)param[5].field_0.field_1.a;
          if (param[5].field_0.field_1.atag == 1) {
            if (local_40 == (PClassActor *)0x0) goto LAB_00685185;
            pPVar6 = local_40;
            if (local_40 != (PClassActor *)AActor::RegistrationInfo.MyClass) {
              do {
                pPVar6 = (PClassActor *)(pPVar6->super_PClass).ParentClass;
                if (pPVar6 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
              } while (pPVar6 != (PClassActor *)0x0);
              if (pPVar6 == (PClassActor *)0x0) {
                pcVar7 = "filter == NULL || filter->IsDescendantOf(RUNTIME_CLASS(AActor))";
                goto LAB_00685294;
              }
            }
          }
          else {
            if (local_40 != (PClassActor *)0x0) goto LAB_0068528d;
LAB_00685185:
            local_40 = (PClassActor *)0x0;
          }
          if (numparam < 7) goto LAB_006851c3;
          VVar1 = param[6].field_0.field_3.Type;
          if (VVar1 == '\0') {
            iVar8 = param[6].field_0.i;
          }
          else {
            iVar8 = 0;
            if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                            ,0x193d,
                            "int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
          }
          if (numparam == 7) goto LAB_006851c6;
          VVar1 = param[7].field_0.field_3.Type;
          if (VVar1 == '\0') {
            selector = param[7].field_0.i;
          }
          else {
            selector = 0;
            if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                            ,0x193e,
                            "int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
          }
          selector_00 = 0;
          if (8 < (uint)numparam) {
            VVar1 = param[8].field_0.field_3.Type;
            if (VVar1 == '\0') {
              selector_00 = param[8].field_0.i;
            }
            else if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                            ,0x193f,
                            "int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
            goto LAB_0068501d;
          }
        }
        selector_00 = 0;
        goto LAB_0068501d;
      }
    }
  }
  selector = 0;
  local_40 = (PClassActor *)0x0;
  iVar4 = 0;
  flags = 0;
  iVar8 = 0;
  selector_00 = 0;
LAB_0068501d:
  source = COPY_AAPTR(origin,selector);
  inflictor = COPY_AAPTR(origin,selector_00);
  killtarget = (origin->tracer).field_0.p;
  if (killtarget != (AActor *)0x0) {
    if (((killtarget->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      local_38.Index = iVar8;
      local_34.Index = iVar4;
      DoKill(killtarget,inflictor,source,&local_34,flags,local_40,&local_38);
    }
    else {
      (origin->tracer).field_0.p = (AActor *)0x0;
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_KillTracer)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_NAME_OPT	(damagetype)	{ damagetype = NAME_None; }
	PARAM_INT_OPT	(flags)			{ flags = 0; }
	PARAM_CLASS_OPT	(filter, AActor){ filter = NULL; }
	PARAM_NAME_OPT	(species)		{ species = NAME_None; }
	PARAM_INT_OPT	(src)			{ src = AAPTR_DEFAULT; }
	PARAM_INT_OPT	(inflict)		{ inflict = AAPTR_DEFAULT; }

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->tracer != NULL)
		DoKill(self->tracer, inflictor, source, damagetype, flags, filter, species);
	return 0;
}